

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O0

Ray * __thiscall ThinLensCamera::generateRay(ThinLensCamera *this,int x,int y,mt19937 *rng)

{
  result_type rVar1;
  Vector3f *v0;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  Ray *in_RDI;
  float fVar2;
  float x_00;
  float fVar3;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  undefined1 auVar5 [16];
  Matrix3f *m;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar4 [16];
  mt19937 *g_00;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Vector3f df;
  float a;
  Vector3f g;
  undefined1 setColumns;
  Vector3f *v;
  mt19937 *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb0;
  Vector3f local_3c;
  float local_30;
  Vector3f local_2c;
  int local_18;
  undefined1 extraout_var [60];
  
  this_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)(double)in_EDX;
  local_18 = in_ECX;
  fVar2 = randf(in_stack_fffffffffffffea0);
  fVar2 = sqrtf(fVar2);
  auVar5._0_8_ = (Vector3f *)(double)fVar2;
  auVar5._8_8_ = extraout_XMM0_Qb;
  v = auVar5._0_8_;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this_00;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = v;
  auVar5 = vcvtusi2sd_avx512f(auVar5,rVar1 & 1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = 0.5 - auVar5._0_8_;
  auVar5 = vfmadd213sd_fma(auVar4,auVar7,auVar9);
  x_00 = (float)(auVar5._0_8_ - (double)((float)(*(int *)(in_RSI + 0x38) + -1) / 2.0));
  g_00 = (mt19937 *)(double)local_18;
  fVar2 = randf(g_00);
  auVar6._0_4_ = sqrtf(fVar2);
  auVar6._4_60_ = extraout_var;
  auVar5 = auVar6._0_16_;
  m = (Matrix3f *)(double)auVar6._0_4_;
  rVar1 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = g_00;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = m;
  auVar5 = vcvtusi2sd_avx512f(auVar5,rVar1 & 1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = 0.5 - auVar5._0_8_;
  auVar5 = vfmadd213sd_fma(auVar8,auVar10,auVar11);
  Vector3f::Vector3f(&local_2c,x_00,
                     (float)(auVar5._0_8_ - (double)((float)(*(int *)(in_RSI + 0x3c) + -1) / 2.0)),
                     *(float *)(in_RSI + 0x40));
  Vector3f::normalize((Vector3f *)this_00);
  setColumns = (undefined1)((ulong)this_00 >> 0x38);
  local_30 = randf(g_00);
  local_30 = local_30 * 6.2831855;
  v0 = (Vector3f *)(in_RSI + 0x20);
  cosf(local_30);
  ::operator*((Vector3f *)m,(float)((ulong)g_00 >> 0x20));
  sinf(local_30);
  ::operator*((Vector3f *)m,(float)((ulong)g_00 >> 0x20));
  ::operator+(v0,(Vector3f *)CONCAT44(x_00,in_stack_fffffffffffffeb0));
  fVar2 = *(float *)(in_RSI + 0x48);
  fVar3 = randf(g_00);
  fVar3 = sqrtf(fVar3);
  Vector3f::operator*=(&local_3c,fVar2 * fVar3);
  ::operator-(v);
  Matrix3f::Matrix3f((Matrix3f *)CONCAT44(x_00,in_stack_fffffffffffffeb0),(Vector3f *)m,
                     (Vector3f *)g_00,v,(bool)setColumns);
  ::operator*(m,(Vector3f *)g_00);
  ::operator+(v0,(Vector3f *)CONCAT44(x_00,in_stack_fffffffffffffeb0));
  ::operator-(v);
  Matrix3f::Matrix3f((Matrix3f *)CONCAT44(x_00,in_stack_fffffffffffffeb0),(Vector3f *)m,
                     (Vector3f *)g_00,v,(bool)setColumns);
  ::operator*((Vector3f *)m,(float)((ulong)g_00 >> 0x20));
  ::operator-(v0,(Vector3f *)CONCAT44(x_00,in_stack_fffffffffffffeb0));
  ::operator*(m,(Vector3f *)g_00);
  Vector3f::normalized((Vector3f *)m);
  std::numeric_limits<float>::max();
  Ray::Ray((Ray *)CONCAT44(x_00,in_stack_fffffffffffffeb0),(Vector3f *)m,(Vector3f *)g_00,
           (float)((ulong)v >> 0x20),SUB84(v,0));
  return in_RDI;
}

Assistant:

Ray generateRay(int x, int y, RNG_TYPE& rng) const override {
		Vector3f g(x + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (width - 1) / 2.0f,
			y + sqrtf(randf(rng)) * (0.5 - rng() % 2) - (height - 1) / 2.0f, dist);
		//Vector3f g((x+randf(rng)-0.5 - (width - 1) / 2.0f), (y+randf(rng)-0.5 - (height - 1) / 2.0f), dist);
		g.normalize();
		float a = randf(rng) * (2 * PI);
		Vector3f df = up * cosf(a) + horizontal * sinf(a); df *= radius*sqrtf(randf(rng));
		return Ray(center + (Matrix3f(horizontal, -up, direction, 1)*df), (Matrix3f(horizontal, -up, direction, 1) *
			(g * length - df)).normalized());
	}